

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetPropertyReference
              (RecyclableObject *instance,PropertyId propertyId,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  undefined1 local_70 [8];
  PropertyValueInfo info;
  Var value;
  ScriptContext *requestContext_local;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_70);
  BVar3 = GetPropertyReference
                    (instance,propertyId,(Var *)&info.inlineCacheIndex,requestContext,
                     (PropertyValueInfo *)local_70);
  if (BVar3 == 0) {
    instance_local = ScriptContext::GetMissingPropertyResult(requestContext);
  }
  else {
    if (info._56_8_ == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x8de,"(value != nullptr)","value != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instance_local = (RecyclableObject *)info._56_8_;
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::GetPropertyReference(RecyclableObject *instance, PropertyId propertyId, ScriptContext* requestContext)
    {
        Var value = nullptr;
        PropertyValueInfo info;
        if (JavascriptOperators::GetPropertyReference(instance, propertyId, &value, requestContext, &info))
        {
            Assert(value != nullptr);
            return value;
        }
        return requestContext->GetMissingPropertyResult();
    }